

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1010::run(TestCase1010 *this)

{
  BuilderArena *params;
  Orphan<capnproto_test::capnp::test::TestTransferCap::Element> *orphan_00;
  Orphanage OVar1;
  Type local_421;
  Client local_420;
  Promise<void> local_410;
  Builder local_400;
  Builder local_3d8;
  undefined1 local_3b0 [8];
  Client cap;
  String local_370;
  Exception local_358;
  Client local_200;
  ArrayPtr<const_char> local_1e8;
  undefined1 local_1d8 [8];
  BuilderFor<capnproto_test::capnp::test::TestTransferCap::Element> e;
  undefined1 local_1a0 [8];
  Orphan<capnproto_test::capnp::test::TestTransferCap::Element> orphan;
  Builder root;
  MallocMessageBuilder message;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase1010 *this_local;
  
  kj::EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  kj::WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&root._builder.dataSize,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestTransferCap>
            ((Builder *)&orphan.builder.location,(MessageBuilder *)&root._builder.dataSize);
  OVar1 = MessageBuilder::getOrphanage((MessageBuilder *)&root._builder.dataSize);
  params = OVar1.arena;
  e._builder._32_8_ = params;
  Orphanage::newOrphan<capnproto_test::capnp::test::TestTransferCap::Element>
            ((Orphan<capnproto_test::capnp::test::TestTransferCap::Element> *)local_1a0,
             (Orphanage *)&e._builder.dataSize);
  Orphan<capnproto_test::capnp::test::TestTransferCap::Element>::get
            ((BuilderFor<capnproto_test::capnp::test::TestTransferCap::Element> *)local_1d8,
             (Orphan<capnproto_test::capnp::test::TestTransferCap::Element> *)local_1a0);
  Text::Reader::Reader((Reader *)&local_1e8,"foo");
  capnproto_test::capnp::test::TestTransferCap::Element::Builder::setText
            ((Builder *)local_1d8,(Reader)local_1e8);
  kj::_::Debug::makeDescription<char_const(&)[9]>
            (&local_370,(Debug *)"\"whatever\"","whatever",(char (*) [9])params);
  kj::Exception::Exception
            (&local_358,FAILED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
             ,0x3fc,&local_370);
  capnproto_test::capnp::test::TestInterface::Client::Client(&local_200,&local_358);
  capnproto_test::capnp::test::TestTransferCap::Element::Builder::setCap
            ((Builder *)local_1d8,&local_200);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_200);
  kj::Exception::~Exception(&local_358);
  kj::String::~String(&local_370);
  capnproto_test::capnp::test::TestTransferCap::Builder::initList
            ((Builder *)&cap.field_0x10,(Builder *)&orphan.builder.location,1);
  orphan_00 = kj::mv<capnp::Orphan<capnproto_test::capnp::test::TestTransferCap::Element>>
                        ((Orphan<capnproto_test::capnp::test::TestTransferCap::Element> *)local_1a0)
  ;
  List<capnproto_test::capnp::test::TestTransferCap::Element,_(capnp::Kind)3>::Builder::
  adoptWithCaveats((Builder *)&cap.field_0x10,0,orphan_00);
  capnproto_test::capnp::test::TestTransferCap::Builder::getList
            (&local_400,(Builder *)&orphan.builder.location);
  List<capnproto_test::capnp::test::TestTransferCap::Element,_(capnp::Kind)3>::Builder::operator[]
            (&local_3d8,&local_400,0);
  capnproto_test::capnp::test::TestTransferCap::Element::Builder::getCap
            ((Client *)local_3b0,&local_3d8);
  Capability::Client::whenResolved(&local_420);
  kj::Promise<void>::
  then<capnp::_::(anonymous_namespace)::TestCase1010::run()::__0,capnp::_::(anonymous_namespace)::TestCase1010::run()::__1>
            (&local_410,(Type *)&local_420,&local_421);
  kj::Promise<void>::wait(&local_410,local_58);
  kj::Promise<void>::~Promise(&local_410);
  kj::Promise<void>::~Promise((Promise<void> *)&local_420);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)local_3b0);
  Orphan<capnproto_test::capnp::test::TestTransferCap::Element>::~Orphan
            ((Orphan<capnproto_test::capnp::test::TestTransferCap::Element> *)local_1a0);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  kj::WaitScope::~WaitScope((WaitScope *)local_58);
  kj::EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Capability, TransferCap) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  MallocMessageBuilder message;
  auto root = message.initRoot<test::TestTransferCap>();

  auto orphan = message.getOrphanage().newOrphan<test::TestTransferCap::Element>();
  auto e = orphan.get();
  e.setText("foo");
  e.setCap(KJ_EXCEPTION(FAILED, "whatever"));

  root.initList(1).adoptWithCaveats(0, kj::mv(orphan));

  // This line used to throw due to capability pointers being incorrectly transferred.
  auto cap = root.getList()[0].getCap();

  cap.whenResolved().then([]() {
    KJ_FAIL_EXPECT("didn't throw?");
  }, [](kj::Exception&&) {
    // success
  }).wait(waitScope);
}